

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logException
          (RootExceptionCallback *this,LogSeverity severity,Exception *e)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ArrayPtr<void_*const> trace;
  ExceptionCallback *pEVar4;
  char *pcVar5;
  ArrayPtr<void_*const> trace_00;
  Type TVar6;
  undefined1 local_b0 [16];
  char *local_a0;
  char *local_98;
  ulong local_90;
  char *local_88;
  ulong local_80;
  Array<char> local_78;
  Array<char> local_60;
  Array<char> local_48;
  
  pEVar4 = getExceptionCallback();
  pcVar2 = e->file;
  uVar1 = e->line;
  TVar6 = e->type;
  uVar3 = (e->description).content.size_;
  local_88 = "";
  if (uVar3 != 0) {
    local_88 = (e->description).content.ptr;
  }
  local_80 = uVar3;
  if (uVar3 < 2) {
    local_80 = 1;
  }
  local_a0 = ": ";
  if (uVar3 < 2) {
    local_a0 = "";
  }
  uVar3 = (e->remoteTrace).content.size_;
  local_98 = "";
  if (uVar3 != 0) {
    local_98 = (e->remoteTrace).content.ptr;
  }
  local_90 = 1;
  if (1 < uVar3) {
    local_90 = uVar3;
  }
  local_b0._8_8_ = "\nremote: ";
  if (1 >= uVar3) {
    local_b0._8_8_ = "";
  }
  pcVar5 = "\nstack: ";
  if (e->traceCount == 0) {
    pcVar5 = "";
  }
  trace.size_._0_4_ = severity;
  trace.ptr = (void **)0x1bb2d2;
  trace.size_._4_4_ = TVar6;
  local_b0._0_8_ = pcVar5;
  stringifyStackTraceAddresses(trace);
  trace_00.ptr = (void **)(ulong)e->traceCount;
  trace_00.size_ = (size_t)pcVar5;
  stringifyStackTrace((String *)&local_60,(kj *)e->trace,trace_00);
  str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
            ((String *)&local_78,(kj *)&stack0xffffffffffffff4c,(Type *)&local_a0,&local_88,
             (StringPtr *)(local_b0 + 8),&local_98,(StringPtr *)local_b0,&local_48.ptr,
             (String *)&local_60,(String *)0x20b012,(char (*) [2])CONCAT44(TVar6,severity));
  (*pEVar4->_vptr_ExceptionCallback[4])(pEVar4,(ulong)severity,pcVar2,(ulong)uVar1,0,&local_78);
  Array<char>::~Array(&local_78);
  Array<char>::~Array(&local_60);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

void logException(LogSeverity severity, Exception&& e) {
    // We intentionally go back to the top exception callback on the stack because we don't want to
    // bypass whatever log processing is in effect.
    //
    // We intentionally don't log the context since it should get re-added by the exception callback
    // anyway.
    getExceptionCallback().logMessage(severity, e.getFile(), e.getLine(), 0, str(
        e.getType(), e.getDescription() == nullptr ? "" : ": ", e.getDescription(),
        e.getRemoteTrace().size() > 0 ? "\nremote: " : "",
        e.getRemoteTrace(),
        e.getStackTrace().size() > 0 ? "\nstack: " : "",
        stringifyStackTraceAddresses(e.getStackTrace()),
        stringifyStackTrace(e.getStackTrace()), "\n"));
  }